

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,int64 value)

{
  int32 iVar1;
  int32 iVar2;
  int32 ebml_size;
  int64 value_local;
  uint64 type_local;
  
  iVar1 = GetUIntSize(type);
  iVar2 = GetIntSize(value);
  return (long)(iVar2 + iVar1 + 1);
}

Assistant:

uint64 EbmlElementSize(uint64 type, int64 value) {
  // Size of EBML ID
  int32 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += GetIntSize(value);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}